

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O1

vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
* __thiscall
VW::config::options_boost_po::get_all_options
          (vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
           *__return_storage_ptr__,options_boost_po *this)

{
  _Rb_tree_node_base *p_Var1;
  shared_ptr<VW::config::base_option> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_options)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    local_38.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(p_Var1 + 2);
    local_38.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[2]._M_parent;
    if ((_Base_ptr)
        local_38.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((_Base_ptr)
                 local_38.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)
                      local_38.
                      super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&((_Base_ptr)
                 local_38.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)
                      local_38.
                      super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_parent + 1;
      }
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,std::allocator<std::shared_ptr<VW::config::base_option>>>
    ::emplace_back<std::shared_ptr<VW::config::base_option>>
              ((vector<std::shared_ptr<VW::config::base_option>,std::allocator<std::shared_ptr<VW::config::base_option>>>
                *)__return_storage_ptr__,&local_38);
    if ((_Base_ptr)
        local_38.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<base_option>> options_boost_po::get_all_options()
{
  std::vector<std::shared_ptr<base_option>> output_values;

  std::transform(m_options.begin(), m_options.end(), std::back_inserter(output_values),
      [](std::pair<const std::string, std::shared_ptr<base_option>>& kv) { return kv.second; });

  return output_values;
}